

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessing.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish::
SoundAnalysisPreprocessing_Vggish
          (SoundAnalysisPreprocessing_Vggish *this,SoundAnalysisPreprocessing_Vggish *from)

{
  ulong uVar1;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__SoundAnalysisPreprocessing_Vggish_0048f110;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

SoundAnalysisPreprocessing_Vggish::SoundAnalysisPreprocessing_Vggish(const SoundAnalysisPreprocessing_Vggish& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing.Vggish)
}